

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O1

void pnga_matmul_basic(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
                      Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,Integer g_c,Integer *clo,
                      Integer *chi)

{
  long lVar1;
  Integer IVar2;
  int iVar3;
  logical lVar4;
  void *buf;
  void *buf_00;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t __size;
  long lVar9;
  long lVar10;
  bool bVar11;
  Integer crank;
  byte *local_6e8;
  byte *local_6e0;
  long *local_6d8;
  Integer brank;
  void *local_6c8;
  char *local_6c0;
  long local_6b8;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  Integer arank;
  Integer atype;
  Integer local_670;
  Integer ld;
  int local_65c;
  char *src_ptr;
  undefined8 local_650;
  Integer ctype;
  Integer btype;
  undefined8 local_638;
  undefined8 uStack_630;
  Integer hit [7];
  Integer lot [7];
  Integer hiB [7];
  Integer hiA [7];
  Integer loB [7];
  Integer loA [7];
  Integer hiC [7];
  Integer loC [7];
  Integer lC [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  _iterator_hdl hdl_c;
  
  local_638 = 0x3ff0000000000000;
  uStack_630 = 0;
  local_650 = 0x3f800000;
  bVar11 = _ga_sync_begin != 0;
  local_65c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_6e8 = (byte *)transb;
  local_6e0 = (byte *)transa;
  local_6d8 = alo;
  local_6c8 = alpha;
  local_670 = g_a;
  if (bVar11) {
    pnga_sync();
  }
  if (((*local_6e0 | 0x20) == 0x74) || ((*local_6e8 | 0x20) == 0x74)) {
    pnga_error("Cannot do basic multiply with tranpose ",0);
  }
  lVar4 = pnga_is_mirrored(local_670);
  if (((lVar4 != 0) || (lVar4 = pnga_is_mirrored(g_b), lVar4 != 0)) ||
     (lVar4 = pnga_is_mirrored(g_c), lVar4 != 0)) {
    pnga_error("Cannot do basic multiply with mirrored arrays ",0);
  }
  pnga_inquire(local_670,&atype,&arank,adims);
  pnga_inquire(g_b,&btype,&brank,bdims);
  pnga_inquire(g_c,&ctype,&crank,cdims);
  if (arank != 2) {
    pnga_error("rank of A must be 2 ",arank);
  }
  if (brank != 2) {
    pnga_error("rank of B must be 2 ",brank);
  }
  if (crank != 2) {
    pnga_error("rank of C must be 2 ",crank);
  }
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  if ((4 < atype - 0x3ebU) || (atype - 0x3ebU == 2)) {
    pnga_error(" type error: type not supported ",atype);
  }
  if (0 < arank) {
    lVar9 = 0;
    do {
      if (((local_6d8[lVar9] < 1) || (adims[lVar9] < local_6d8[lVar9])) ||
         (ahi[lVar9] < 1 || adims[lVar9] < ahi[lVar9])) {
        pnga_error("Patch is out of bounds for A ",0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < arank);
  }
  if (0 < brank) {
    lVar9 = 0;
    do {
      if (((blo[lVar9] < 1) || (bdims[lVar9] < blo[lVar9])) ||
         (bhi[lVar9] < 1 || bdims[lVar9] < bhi[lVar9])) {
        pnga_error("Patch is out of bounds for B ",0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < brank);
  }
  if (0 < crank) {
    lVar9 = 0;
    do {
      if (((clo[lVar9] < 1) || (cdims[lVar9] < clo[lVar9])) ||
         (chi[lVar9] < 1 || cdims[lVar9] < chi[lVar9])) {
        pnga_error("Patch is out of bounds for C ",0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < crank);
  }
  if (0 < arank) {
    lVar9 = 0;
    do {
      if (ahi[lVar9] < local_6d8[lVar9]) {
        pnga_error("No data in patch on A ",0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < arank);
  }
  if (0 < brank) {
    lVar9 = 0;
    do {
      if (bhi[lVar9] < blo[lVar9]) {
        pnga_error("No data in patch on B ",0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < brank);
  }
  if (0 < crank) {
    lVar9 = 0;
    do {
      if (chi[lVar9] < clo[lVar9]) {
        pnga_error("No data in patch on C ",0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < crank);
  }
  lVar9 = *ahi;
  lVar10 = *local_6d8;
  lVar6 = bhi[1];
  lVar1 = blo[1];
  if (ahi[1] - local_6d8[1] != *bhi - *blo) {
    pnga_error("Inner dimensions of A and B do not match ",0);
  }
  if ((lVar9 - lVar10 != *chi - *clo) || (lVar6 - lVar1 != chi[1] - clo[1])) {
    pnga_error("Outer dimensions of A and B do not match dimensions of C ",0);
  }
  pnga_scale_patch(g_c,clo,chi,beta);
  pnga_local_iterator_init(g_c,&hdl_c);
  iVar3 = pnga_local_iterator_next(&hdl_c,loC,hiC,&src_ptr,lC);
  lVar9 = crank;
  while (iVar3 != 0) {
    crank = lVar9;
    if (0 < lVar9) {
      memcpy(lot,loC,lVar9 * 8);
      memcpy(hit,hiC,lVar9 * 8);
    }
    lVar4 = pnga_patch_intersect(loC,hiC,lot,hit,lVar9);
    IVar2 = lot[0];
    if (lVar4 != 0) {
      lVar9 = ahi[1] - local_6d8[1];
      lVar10 = (hit[0] - lot[0]) + 1;
      local_6b8 = (lVar9 + 1) / lVar10;
      uVar8 = (ulong)(lVar10 * local_6b8 - lVar9 == 0 || lVar10 * local_6b8 < lVar9);
      local_6c0 = src_ptr + ((lot[0] - loC[0]) + (lot[1] - loC[1]) * lC[0]) *
                            *(long *)(BYTE_ARRAY_001d3521 + atype * 0x10 + 0x67);
      uVar7 = ((hit[1] - lot[1]) + 1) * lVar10;
      __size = *(long *)(BYTE_ARRAY_001d3521 + atype * 0x10 + 0x67) * uVar7;
      buf = malloc(__size);
      buf_00 = malloc(__size);
      bVar11 = SCARRY8(uVar8,local_6b8);
      lVar9 = uVar8 + local_6b8;
      local_6b8 = lVar9;
      if (lVar9 != 0 && bVar11 == lVar9 < 0) {
        lVar10 = (IVar2 - *clo) / lVar10 << 0x20;
        do {
          lVar6 = (lVar10 >> 0x20) % local_6b8;
          ld = (hit[0] - lot[0]) + 1;
          loA[1] = ld * lVar6 + local_6d8[1];
          loA[0] = lot[0];
          hiA[0] = hit[0];
          hiA[1] = (hit[0] - lot[0]) + loA[1];
          if (ahi[1] <= hiA[1]) {
            hiA[1] = ahi[1];
          }
          uVar8 = ((hiA[1] - loA[1]) + 1) * ld;
          if (uVar8 - uVar7 != 0 && (long)uVar7 <= (long)uVar8) {
            uVar5 = pnga_nodeid();
            printf("p[%d] size_a: %d size_c: %d\n",uVar5 & 0xffffffff,uVar8 & 0xffffffff,
                   uVar7 & 0xffffffff);
          }
          pnga_get(local_670,loA,hiA,buf,&ld);
          loB[1] = lot[1];
          hiB[1] = hit[1];
          loB[0] = ((hit[0] - lot[0]) + 1) * lVar6 + *blo;
          hiB[0] = (hit[0] - lot[0]) + loB[0];
          if (*bhi <= hiB[0]) {
            hiB[0] = *bhi;
          }
          ld = (hiB[0] - loB[0]) + 1;
          uVar8 = ((hit[1] - lot[1]) + 1) * ld;
          if (uVar8 - uVar7 != 0 && (long)uVar7 <= (long)uVar8) {
            uVar5 = pnga_nodeid();
            printf("p[%d] size_b: %d size_c: %d\n",uVar5 & 0xffffffff,uVar8 & 0xffffffff,
                   uVar7 & 0xffffffff);
          }
          pnga_get(g_b,loB,hiB,buf_00,&ld);
          adim_t = (hiA[0] - loA[0]) + 1;
          kdim_t = (hiA[1] - loA[1]) + 1;
          jdim_t = (hiB[1] - loB[1]) + 1;
          bdim_t = (hiB[0] - loB[0]) + 1;
          cdim_t = lC[0];
          idim_t = adim_t;
          switch(atype) {
          case 0x3eb:
            gal_sgemm_(local_6e0,local_6e8,&idim_t,&jdim_t,&kdim_t,local_6c8,buf,&adim_t,buf_00,
                       &bdim_t,&local_650,local_6c0,&cdim_t,1,1);
            break;
          case 0x3ec:
            gal_dgemm_(local_6e0,local_6e8,&idim_t,&jdim_t,&kdim_t,local_6c8,buf,&adim_t,buf_00,
                       &bdim_t,&local_638,local_6c0,&cdim_t,1,1);
            break;
          default:
            pnga_error("ga_matmul_basic: wrong data type",atype);
            break;
          case 0x3ee:
            gal_cgemm_(local_6e0,local_6e8,&idim_t,&jdim_t,&kdim_t,local_6c8,buf,&adim_t,buf_00,
                       &bdim_t,&local_650,local_6c0,&cdim_t,1,1);
            break;
          case 0x3ef:
            gal_zgemm_(local_6e0,local_6e8,&idim_t,&jdim_t,&kdim_t,local_6c8,buf,&adim_t,buf_00,
                       &bdim_t,&local_638,local_6c0,&cdim_t,1,1);
          }
          lVar10 = lVar10 + 0x100000000;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      free(buf);
      free(buf_00);
    }
    iVar3 = pnga_local_iterator_next(&hdl_c,loC,hiC,&src_ptr,lC);
    lVar9 = crank;
  }
  if (local_65c != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_matmul_basic(char *transa, char *transb, void *alpha, void *beta,
		                 Integer g_a, Integer alo[], Integer ahi[], 
                       Integer g_b, Integer blo[], Integer bhi[], 
		                 Integer g_c, Integer clo[], Integer chi[])
{
  Integer atype, btype, ctype;
  Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM],cdims[GA_MAX_DIM],tmpld[GA_MAX_DIM];
  Integer n, m, k, nb, adim, bdim, cdim, arank, brank, crank;
  Integer loC[MAXDIM], hiC[MAXDIM], lot[MAXDIM], hit[MAXDIM], lC[MAXDIM];
  Integer nlo, loA[MAXDIM], hiA[MAXDIM], loB[MAXDIM], hiB[MAXDIM];
  DoubleComplex ONE_Z;
  SingleComplex ONE_F;
  BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;
  char *src_ptr;
  _iterator_hdl hdl_c;
  int local_sync_begin,local_sync_end;

  ONE_Z.real = 1.0;
  ONE_Z.imag = 0.0;
  ONE_F.real = 1.0;
  ONE_F.imag = 0.0;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  /* For the time being, punt on transposes*/
  if (*transa == 't' || *transa == 'T' || *transb == 't' || *transb == 'T') {
    pnga_error("Cannot do basic multiply with tranpose ",0);
  }
  /* For the time being, punt on mirrored arrays */
  if (pnga_is_mirrored(g_a) || pnga_is_mirrored(g_b) || pnga_is_mirrored(g_c)) {
    pnga_error("Cannot do basic multiply with mirrored arrays ",0);
  }


  pnga_inquire(g_a, &atype, &arank, adims);
  pnga_inquire(g_b, &btype, &brank, bdims);
  pnga_inquire(g_c, &ctype, &crank, cdims);

  /* Can't handle dimensions other than 2 */
  if(arank != 2)  pnga_error("rank of A must be 2 ",arank);
  if(brank != 2)  pnga_error("rank of B must be 2 ",brank);
  if(crank != 2)  pnga_error("rank of C must be 2 ",crank);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
  if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
    pnga_error(" type error: type not supported ",atype);

  /* Check that patch dims are reasonable */
  for (n=0; n<arank; n++) {
    if (alo[n] <= 0 || alo[n] > adims[n] || ahi[n] <= 0 || ahi[n] > adims[n]) {
      pnga_error("Patch is out of bounds for A ",0);
    }
  }
  for (n=0; n<brank; n++) {
    if (blo[n] <= 0 || blo[n] > bdims[n] || bhi[n] <= 0 || bhi[n] > bdims[n]) {
      pnga_error("Patch is out of bounds for B ",0);
    }
  }
  for (n=0; n<crank; n++) {
    if (clo[n] <= 0 || clo[n] > cdims[n] || chi[n] <= 0 || chi[n] > cdims[n]) {
      pnga_error("Patch is out of bounds for C ",0);
    }
  }

  /* Check that multiplication is feasible */
  for (n=0; n<arank; n++) {
    if (ahi[n]<alo[n]) pnga_error("No data in patch on A ",0);
  }

  for (n=0; n<brank; n++) {
    if (bhi[n]<blo[n]) pnga_error("No data in patch on B ",0);
  }
  for (n=0; n<crank; n++) {
    if (chi[n]<clo[n]) pnga_error("No data in patch on C ",0);
  }
  m = ahi[0]-alo[0]+1;
  k = ahi[1]-alo[1]+1;
  n = bhi[1]-blo[1]+1;
  if (k != bhi[0]-blo[0]+1) {
    pnga_error("Inner dimensions of A and B do not match ",0);
  }
  if (m != chi[0]-clo[0]+1 || n != chi[1]-clo[1]+1) {
    pnga_error("Outer dimensions of A and B do not match dimensions of C ",0);
  }

  /* Scale patch of C by beta */
  pnga_scale_patch(g_c,clo,chi,beta);

  /* Multiplication is feasible. Start iterating over patches of C */
  pnga_local_iterator_init(g_c, &hdl_c);
  while (pnga_local_iterator_next(&hdl_c, loC, hiC, &src_ptr, lC)) {
    Integer num_blocks;
    Integer offset, elemsize, ld;
    void *a_buf, *b_buf, *c_buf;
    Integer size_a, size_b, size_c;
    /*
    printf("p[%d] loC[0]: %d hiC[0]: %d loC[1]: %d hiC[1]: %d lC[0]: %d\n",
        pnga_nodeid(),loC[0],hiC[0],loC[1],hiC[1],lC[0]);
        */
    /* Copy limits since patch intersect modifies loC array */
    for (n=0; n<crank; n++) {
      lot[n] = loC[n];
      hit[n] = hiC[n];
    }

    /* check to see if this block overlaps with patch on C */
    if (pnga_patch_intersect(loC,hiC,lot,hit,crank)) {
      int istart, in;

      /* Calculating number of blocks for inner dimension. Assume that 
       * number of rows in block returned by iterator is a good size */
      num_blocks = (ahi[1]-alo[1]+1)/(hit[0]-lot[0]+1);
      if (num_blocks*(hit[0]-lot[0]+1) < ahi[1]-alo[1]+1) num_blocks++;

      /* Calculate offset from  src_ptr to beginning of lot */ 
      offset = lC[0]*(lot[1]-loC[1])+lot[0]-loC[0];
      elemsize = GAsizeofM(atype);
      c_buf = (void*)((char*)src_ptr + elemsize*offset);
      a_buf = (void*)malloc((hit[0]-lot[0]+1)*(hit[1]-lot[1]+1)*elemsize);
      b_buf = (void*)malloc((hit[0]-lot[0]+1)*(hit[1]-lot[1]+1)*elemsize);
      size_c = (hit[0]-lot[0]+1)*(hit[1]-lot[1]+1);

      /* calculate starting block index */
      istart = (lot[0]-clo[0])/(hit[0]-lot[0]+1);

      /* loop over block pairs */
      for (nb=0; nb<num_blocks; nb++) {
        /*
    printf("p[%d] loC[0]: %d hiC[0]: %d loC[1]: %d hiC[1]: %d\n",pnga_nodeid(),
        lot[0],hit[0],lot[1],hit[1]);
        */
        in = istart + nb;
        in = in%num_blocks;
        nlo = alo[1]+in*(hit[0]-lot[0]+1);
        loA[0] = lot[0];
        hiA[0] = hit[0];
        loA[1] = nlo;
        hiA[1] = loA[1]+(hit[0]-lot[0]);
        if (hiA[1] > ahi[1]) hiA[1] = ahi[1];
        ld = hiA[0]-loA[0]+1;
        size_a = (hiA[0]-loA[0]+1)*(hiA[1]-loA[1]+1);
        if (size_a > size_c) {
          printf("p[%d] size_a: %d size_c: %d\n",(int)pnga_nodeid(),(int)size_a,(int)size_c);
        }
        /*
    printf("p[%d] loA[0]: %d hiA[0]: %d loA[1]: %d hiA[1]: %d\n",pnga_nodeid(),
        loA[0],hiA[0],loA[1],hiA[1]);
        */
        pnga_get(g_a,loA,hiA,a_buf,&ld);
        /*
        printBlock("Matrix A",atype,a_buf,loA,hiA,&ld);
        */
        loB[1] = lot[1];
        hiB[1] = hit[1];
        nlo = blo[0]+in*(hit[0]-lot[0]+1);
        loB[0] = nlo;
        hiB[0] = loB[0]+(hit[0]-lot[0]);
        if (hiB[0] > bhi[0]) hiB[0] = bhi[0];
        ld = hiB[0]-loB[0]+1;
        size_b = (hiB[0]-loB[0]+1)*(hiB[1]-loB[1]+1);
        if (size_b > size_c) {
          printf("p[%d] size_b: %d size_c: %d\n",(int)pnga_nodeid(),
              (int)size_b,(int)size_c);
        }
        /*
    printf("p[%d] loB[0]: %d hiB[0]: %d loB[1]: %d hiB[1]: %d\n",pnga_nodeid(),
        loB[0],hiB[0],loB[1],hiB[1]);
        */
        pnga_get(g_b,loB,hiB,b_buf,&ld);
        /*
        printBlock("Matrix B",btype,b_buf,loB,hiB,&ld);
        */

        idim_t=(BlasInt)(hiA[0]-loA[0]+1);
        kdim_t=(BlasInt)(hiA[1]-loA[1]+1);
        jdim_t=(BlasInt)(hiB[1]-loB[1]+1);
        adim_t=hiA[0]-loA[0]+1;
        bdim_t=hiB[0]-loB[0]+1;
        cdim_t=lC[0];

        /*
        printf("p[%d] idim: %d jdim: %d kdim: %d adim: %d bdim: %d cdim: %d\n",
            pnga_nodeid(),idim_t,jdim_t,kdim_t,adim_t,bdim_t,cdim_t);
            */
        switch(atype) {
          case C_FLOAT:
            BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (Real *)alpha, (Real *)a_buf, &adim_t,
                (Real *)b_buf, &bdim_t, (Real *)&ONE_F,
                (Real *)c_buf, &cdim_t);
            break;
          case C_DBL:
            BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (DoublePrecision *)alpha, (DoublePrecision *)a_buf, &adim_t,
                (DoublePrecision *)b_buf, &bdim_t, (DoublePrecision *)&ONE_Z,
                (DoublePrecision *)c_buf, &cdim_t);
            break;
          case C_DCPL:
            BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (DoubleComplex *)alpha, (DoubleComplex *)a_buf, &adim_t,
                (DoubleComplex *)b_buf, &bdim_t, (DoubleComplex *)&ONE_Z,
                (DoubleComplex *)c_buf, &cdim_t);
            break;
          case C_SCPL:
            BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (SingleComplex *)alpha, (SingleComplex *)a_buf, &adim_t,
                (SingleComplex *)b_buf, &bdim_t, (SingleComplex *)&ONE_F,
                (SingleComplex *)c_buf, &cdim_t);
            break;
		  default:
		    pnga_error("ga_matmul_basic: wrong data type", atype);
		  }
      }

      /* multiplication is done, free buffers */
      free(a_buf);
      free(b_buf);
    }
  }
  if(local_sync_end)pnga_sync(); 
}